

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,size_t num_tokens)

{
  char cVar1;
  int iVar2;
  jsmntok_t *pjVar3;
  jsmntype_t jVar4;
  ulong uVar5;
  bool bVar6;
  jsmntok_t *t;
  jsmntype_t type;
  char c;
  jsmntok_t *pjStack_48;
  int count;
  jsmntok_t *token;
  int i;
  int r;
  size_t num_tokens_local;
  jsmntok_t *tokens_local;
  size_t len_local;
  char *js_local;
  jsmn_parser *parser_local;
  
  type = parser->toknext;
  do {
    bVar6 = false;
    if (parser->pos < len) {
      bVar6 = js[parser->pos] != '\0';
    }
    if (!bVar6) {
      if (tokens != (jsmntok_t *)0x0) {
        token._0_4_ = parser->toknext;
        while (token._0_4_ = (uint)token - 1, -1 < (int)(uint)token) {
          if ((tokens[(int)(uint)token].start != -1) && (tokens[(int)(uint)token].end == -1)) {
            return -3;
          }
        }
      }
      return type;
    }
    cVar1 = js[parser->pos];
    switch(cVar1) {
    case '\t':
    case '\n':
    case '\r':
    case ' ':
      break;
    default:
      return -2;
    case '\"':
      iVar2 = jsmn_parse_string(parser,js,len,tokens,num_tokens);
      if (iVar2 < 0) {
        return iVar2;
      }
      type = type + JSMN_OBJECT;
      if ((parser->toksuper != -1) && (tokens != (jsmntok_t *)0x0)) {
        tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
      }
      break;
    case ',':
      if ((((tokens != (jsmntok_t *)0x0) && (parser->toksuper != -1)) &&
          (tokens[parser->toksuper].type != JSMN_ARRAY)) &&
         (tokens[parser->toksuper].type != JSMN_OBJECT)) {
        parser->toksuper = tokens[parser->toksuper].parent;
      }
      break;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case 'f':
    case 'n':
    case 't':
      if (((tokens != (jsmntok_t *)0x0) && (parser->toksuper != -1)) &&
         ((pjVar3 = tokens + parser->toksuper, pjVar3->type == JSMN_OBJECT ||
          ((pjVar3->type == JSMN_STRING && (pjVar3->size != 0)))))) {
        return -2;
      }
      iVar2 = jsmn_parse_primitive(parser,js,len,tokens,num_tokens);
      if (iVar2 < 0) {
        return iVar2;
      }
      type = type + JSMN_OBJECT;
      if ((parser->toksuper != -1) && (tokens != (jsmntok_t *)0x0)) {
        tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
      }
      break;
    case ':':
      parser->toksuper = parser->toknext - 1;
      break;
    case '[':
    case '{':
      type = type + JSMN_OBJECT;
      if (tokens != (jsmntok_t *)0x0) {
        pjVar3 = jsmn_alloc_token(parser,tokens,num_tokens);
        if (pjVar3 == (jsmntok_t *)0x0) {
          return -1;
        }
        if (parser->toksuper != -1) {
          tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
          pjVar3->parent = parser->toksuper;
        }
        jVar4 = JSMN_ARRAY;
        if (cVar1 == '{') {
          jVar4 = JSMN_OBJECT;
        }
        pjVar3->type = jVar4;
        pjVar3->start = parser->pos;
        parser->toksuper = parser->toknext - 1;
      }
      break;
    case ']':
    case '}':
      if (tokens != (jsmntok_t *)0x0) {
        jVar4 = JSMN_ARRAY;
        if (cVar1 == '}') {
          jVar4 = JSMN_OBJECT;
        }
        if (parser->toknext == 0) {
          return -2;
        }
        uVar5 = (ulong)(parser->toknext - 1);
        while( true ) {
          pjStack_48 = tokens + uVar5;
          if ((pjStack_48->start != -1) && (pjStack_48->end == -1)) {
            if (pjStack_48->type != jVar4) {
              return -2;
            }
            pjStack_48->end = parser->pos + 1;
            parser->toksuper = pjStack_48->parent;
            goto LAB_00199fc7;
          }
          if (pjStack_48->parent == -1) break;
          uVar5 = (ulong)pjStack_48->parent;
        }
        if ((pjStack_48->type != jVar4) || (parser->toksuper == -1)) {
          return -2;
        }
      }
    }
LAB_00199fc7:
    parser->pos = parser->pos + 1;
  } while( true );
}

Assistant:

static int jsmn_parse(jsmn_parser *parser, const char *js, size_t len,
                      jsmntok_t *tokens, size_t num_tokens) {
    int r;
    int i;
    jsmntok_t *token;
    int count = parser->toknext;

    for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
        char c;
        jsmntype_t type;

        c = js[parser->pos];
        switch (c) {
            case '{': case '[':
                count++;
                if (tokens == NULL) {
                    break;
                }
                token = jsmn_alloc_token(parser, tokens, num_tokens);
                if (token == NULL)
                    return JSMN_ERROR_NOMEM;
                if (parser->toksuper != -1) {
                    tokens[parser->toksuper].size++;
#ifdef JSMN_PARENT_LINKS
                    token->parent = parser->toksuper;
#endif
                }
                token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
                token->start = parser->pos;
                parser->toksuper = parser->toknext - 1;
                break;
            case '}': case ']':
                if (tokens == NULL)
                    break;
                type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
                if (parser->toknext < 1) {
                    return JSMN_ERROR_INVAL;
                }
                token = &tokens[parser->toknext - 1];
                for (;;) {
                    if (token->start != -1 && token->end == -1) {
                        if (token->type != type) {
                            return JSMN_ERROR_INVAL;
                        }
                        token->end = parser->pos + 1;
                        parser->toksuper = token->parent;
                        break;
                    }
                    if (token->parent == -1) {
                        if(token->type != type || parser->toksuper == -1) {
                            return JSMN_ERROR_INVAL;
                        }
                        break;
                    }
                    token = &tokens[token->parent];
                }
#else
                for (i = parser->toknext - 1; i >= 0; i--) {
				token = &tokens[i];
				if (token->start != -1 && token->end == -1) {
					if (token->type != type) {
						return JSMN_ERROR_INVAL;
					}
					parser->toksuper = -1;
					token->end = parser->pos + 1;
					break;
				}
			}
			/* Error if unmatched closing bracket */
			if (i == -1) return JSMN_ERROR_INVAL;
			for (; i >= 0; i--) {
				token = &tokens[i];
				if (token->start != -1 && token->end == -1) {
					parser->toksuper = i;
					break;
				}
			}
#endif
                break;
            case '\"':
                r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
                if (r < 0) return r;
                count++;
                if (parser->toksuper != -1 && tokens != NULL)
                    tokens[parser->toksuper].size++;
                break;
            case '\t' : case '\r' : case '\n' : case ' ':
                break;
            case ':':
                parser->toksuper = parser->toknext - 1;
                break;
            case ',':
                if (tokens != NULL && parser->toksuper != -1 &&
                    tokens[parser->toksuper].type != JSMN_ARRAY &&
                    tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
                    parser->toksuper = tokens[parser->toksuper].parent;
#else
                    for (i = parser->toknext - 1; i >= 0; i--) {
					if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
						if (tokens[i].start != -1 && tokens[i].end == -1) {
							parser->toksuper = i;
							break;
						}
					}
				}
#endif
                }
                break;
#ifdef JSMN_STRICT
                /* In strict mode primitives are: numbers and booleans */
            case '-': case '0': case '1' : case '2': case '3' : case '4':
            case '5': case '6': case '7' : case '8': case '9':
            case 't': case 'f': case 'n' :
                /* And they must not be keys of the object */
                if (tokens != NULL && parser->toksuper != -1) {
                    jsmntok_t *t = &tokens[parser->toksuper];
                    if (t->type == JSMN_OBJECT ||
                        (t->type == JSMN_STRING && t->size != 0)) {
                        return JSMN_ERROR_INVAL;
                    }
                }
#else
                /* In non-strict mode every unquoted value is a primitive */
		default:
#endif
                r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
                if (r < 0) return r;
                count++;
                if (parser->toksuper != -1 && tokens != NULL)
                    tokens[parser->toksuper].size++;
                break;

#ifdef JSMN_STRICT
                /* Unexpected char in strict mode */
            default:
                return JSMN_ERROR_INVAL;
#endif
        }
    }

    if (tokens != NULL) {
        for (i = parser->toknext - 1; i >= 0; i--) {
            /* Unmatched opened object or array */
            if (tokens[i].start != -1 && tokens[i].end == -1) {
                return JSMN_ERROR_PART;
            }
        }
    }

    return count;
}